

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O1

FilterResult __thiscall
duckdb::FilterCombiner::AddFilter
          (FilterCombiner *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr)

{
  FilterResult FVar1;
  type expr_00;
  
  expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                      (expr);
  FVar1 = AddFilter(this,expr_00);
  if (FVar1 == UNSUPPORTED) {
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&this->remaining_filters,expr);
    FVar1 = SUCCESS;
  }
  return FVar1;
}

Assistant:

FilterResult FilterCombiner::AddFilter(unique_ptr<Expression> expr) {
	//	LookUpConjunctions(expr.get());
	// try to push the filter into the combiner
	auto result = AddFilter(*expr);
	if (result == FilterResult::UNSUPPORTED) {
		// unsupported filter, push into remaining filters
		remaining_filters.push_back(std::move(expr));
		return FilterResult::SUCCESS;
	}
	return result;
}